

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O3

void pp_tree_avl_balance_remove(PTreeAVLNode *node,PTreeBaseNode **root)

{
  PTreeAVLNode *pPVar1;
  pint pVar2;
  int iVar3;
  PTreeAVLNode_ *pPVar4;
  
  pPVar4 = node->parent;
  if (pPVar4 != (PTreeAVLNode_ *)0x0) {
    pVar2 = 1;
    do {
      pPVar1 = (PTreeAVLNode *)(pPVar4->base).left;
      iVar3 = pPVar4->balance_factor;
      if (pPVar1 == node) {
        if (iVar3 != -1) {
          if (iVar3 == 0) {
            pVar2 = -1;
            goto LAB_0010a716;
          }
          goto LAB_0010a6ba;
        }
        pPVar1 = (PTreeAVLNode *)(pPVar4->base).right;
        iVar3 = pPVar1->balance_factor;
        if (iVar3 != 1) {
          pp_tree_avl_rotate_left(pPVar1,root);
          goto LAB_0010a70c;
        }
        pp_tree_avl_rotate_right_left(pPVar1,root);
      }
      else if (iVar3 == 1) {
        iVar3 = pPVar1->balance_factor;
        if (iVar3 == -1) {
          pp_tree_avl_rotate_left_right(pPVar1,root);
        }
        else {
          pp_tree_avl_rotate_right(pPVar1,root);
LAB_0010a70c:
          if (iVar3 == 0) {
            return;
          }
        }
      }
      else {
        if (iVar3 == 0) {
LAB_0010a716:
          pPVar4->balance_factor = pVar2;
          return;
        }
LAB_0010a6ba:
        pPVar4->balance_factor = 0;
        pPVar4 = node;
      }
      node = pPVar4->parent;
      pPVar4 = node->parent;
    } while (pPVar4 != (PTreeAVLNode_ *)0x0);
  }
  return;
}

Assistant:

static void
pp_tree_avl_balance_remove (PTreeAVLNode *node, PTreeBaseNode **root)
{
	PTreeAVLNode	*parent;
	PTreeAVLNode	*sibling;
	pint		sibling_balance;

	while (TRUE) {
		parent = node->parent;

		if (P_UNLIKELY (parent == NULL))
			break;

		if (parent->base.left == (PTreeBaseNode *) node) {
			if (parent->balance_factor == -1) {
				sibling         = (PTreeAVLNode *) parent->base.right;
				sibling_balance = sibling->balance_factor;

				if (sibling->balance_factor == 1)
					/* Case 1 */
					pp_tree_avl_rotate_right_left (sibling, root);
				else
					/* Case 2 */
					pp_tree_avl_rotate_left (sibling, root);

				node = parent;

				if (sibling_balance == 0)
					break;
			} else if (parent->balance_factor == 0) {
				/* Case 3 */
				parent->balance_factor = -1;
				break;
			} else
				/* Case 4 */
				parent->balance_factor = 0;
		} else {
			if (parent->balance_factor == 1) {
				sibling         = (PTreeAVLNode *) parent->base.left;
				sibling_balance = sibling->balance_factor;

				if (sibling->balance_factor == -1)
					/* Case 1 */
					pp_tree_avl_rotate_left_right (sibling, root);
				else
					/* Case 2 */
					pp_tree_avl_rotate_right (sibling, root);

				node = parent;

				if (sibling_balance == 0)
					break;
			} else if (parent->balance_factor == 0) {
				/* Case 3 */
				parent->balance_factor = 1;
				break;
			} else
				/* Case 4 */
				parent->balance_factor = 0;
		}

		node = node->parent;
	}
}